

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::checkAndLogProgram
               (ShaderProgram *program,Program *programDefinition,Functions *gl,TestLog *log)

{
  bool bVar1;
  MessageBuilder *this;
  TestError *this_00;
  allocator<char> local_231;
  string local_230;
  MessageBuilder local_210;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_51;
  string local_50;
  ScopedLogSection local_30;
  ScopedLogSection section;
  TestLog *log_local;
  Functions *gl_local;
  Program *programDefinition_local;
  ShaderProgram *program_local;
  
  section.m_log = log;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"Program",&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"Program",&local_89);
  tcu::ScopedLogSection::ScopedLogSection(&local_30,log,&local_50,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  glu::operator<<(section.m_log,program);
  bVar1 = glu::ShaderProgram::isOk(program);
  if (!bVar1) {
    tcu::TestLog::operator<<(&local_210,section.m_log,(BeginMessageToken *)&tcu::TestLog::Message);
    this = tcu::MessageBuilder::operator<<
                     (&local_210,
                      (char (*) [73])
                      "Program build failed, checking if program exceeded implementation limits");
    tcu::MessageBuilder::operator<<(this,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_210);
    checkProgramResourceUsage(programDefinition,gl,section.m_log);
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_230,"could not build program",&local_231);
    tcu::TestError::TestError(this_00,&local_230);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_30);
  return;
}

Assistant:

static void checkAndLogProgram (const glu::ShaderProgram& program, const ProgramInterfaceDefinition::Program* programDefinition, const glw::Functions& gl, tcu::TestLog& log)
{
	const tcu::ScopedLogSection section(log, "Program", "Program");

	log << program;
	if (!program.isOk())
	{
		log << tcu::TestLog::Message << "Program build failed, checking if program exceeded implementation limits" << tcu::TestLog::EndMessage;
		checkProgramResourceUsage(programDefinition, gl, log);

		// within limits
		throw tcu::TestError("could not build program");
	}
}